

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_reliability(REF_GEOM ref_geom,REF_INT geom,REF_DBL *slop)

{
  uint uVar1;
  double local_50;
  double local_48;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL gap;
  REF_DBL tol;
  REF_DBL *slop_local;
  REF_GEOM pRStack_18;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  *slop = 0.0;
  tol = (REF_DBL)slop;
  slop_local._4_4_ = geom;
  pRStack_18 = ref_geom;
  uVar1 = ref_egads_tolerance(ref_geom,ref_geom->descr[geom * 6],ref_geom->descr[geom * 6 + 1],&gap)
  ;
  if (uVar1 == 0) {
    if (*(double *)tol <= pRStack_18->tolerance_protection * gap) {
      local_48 = pRStack_18->tolerance_protection * gap;
    }
    else {
      local_48 = *(double *)tol;
    }
    *(double *)tol = local_48;
    ref_geom_local._4_4_ =
         ref_egads_gap(pRStack_18,pRStack_18->descr[slop_local._4_4_ * 6 + 5],
                       (REF_DBL *)&ref_private_macro_code_rss_1);
    if (ref_geom_local._4_4_ == 0) {
      if (*(double *)tol <= pRStack_18->gap_protection * _ref_private_macro_code_rss_1) {
        local_50 = pRStack_18->gap_protection * _ref_private_macro_code_rss_1;
      }
      else {
        local_50 = *(double *)tol;
      }
      *(double *)tol = local_50;
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xa40,
             "ref_geom_reliability",(ulong)ref_geom_local._4_4_,"gap");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xa36,
           "ref_geom_reliability",(ulong)uVar1,"tol");
    ref_geom_local._4_4_ = uVar1;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_reliability(REF_GEOM ref_geom, REF_INT geom,
                                        REF_DBL *slop) {
  REF_DBL tol, gap;
  *slop = 0.0;
  RSS(ref_egads_tolerance(ref_geom, ref_geom_type(ref_geom, geom),
                          ref_geom_id(ref_geom, geom), &tol),
      "tol");
  *slop = MAX(*slop, ref_geom_tolerance_protection(ref_geom) * tol);
  /*
    each_ref_geom_having_node(ref_geom, node, item, geom) {
      RSS(ref_geom_tolerance(ref_geom, ref_geom_type(ref_geom, geom),
                             ref_geom_id(ref_geom, geom), &tol),
          "tol");
      *slop = MAX(*slop, ref_geom_tolerance_protection(ref_geom) * tol);
    }
  */
  RSS(ref_egads_gap(ref_geom, ref_geom_node(ref_geom, geom), &gap), "gap");
  *slop = MAX(*slop, ref_geom_gap_protection(ref_geom) * gap);
  return REF_SUCCESS;
}